

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ReadMemoryResponse>::destruct
          (BasicTypeInfo<dap::ReadMemoryResponse> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ReadMemoryResponse> *this_local;
  
  ReadMemoryResponse::~ReadMemoryResponse((ReadMemoryResponse *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }